

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clockbounds.cc
# Opt level: O3

void __thiscall
tchecker::clockbounds::local_m_map_t::resize
          (local_m_map_t *this,loc_id_t loc_nb,clock_id_t clock_nb)

{
  make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_> *pmVar1;
  undefined1 auVar2 [16];
  map_t *pmVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar8;
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  value_type local_20;
  long lVar10;
  
  clear(this);
  this->_loc_nb = loc_nb;
  this->_clock_nb = clock_nb;
  local_20 = (value_type)0x0;
  std::
  vector<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
  ::resize(&this->_M,(ulong)loc_nb,&local_20);
  if (this->_loc_nb != 0) {
    uVar6 = 0;
    do {
      pmVar3 = allocate_map((ulong)this->_clock_nb);
      auVar2 = _DAT_001d5360;
      (this->_M).
      super__Vector_base<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar6] = pmVar3;
      pmVar1 = (this->_M).
               super__Vector_base<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar6];
      uVar4 = (ulong)(pmVar1->super_array_capacity_t<unsigned_int>)._capacity;
      if (uVar4 != 0) {
        lVar10 = uVar4 - 1;
        auVar7._8_4_ = (int)lVar10;
        auVar7._0_8_ = lVar10;
        auVar7._12_4_ = (int)((ulong)lVar10 >> 0x20);
        auVar7 = auVar7 ^ auVar2;
        uVar5 = 0;
        auVar9 = _DAT_001d5350;
        auVar11 = _DAT_001d6a50;
        do {
          auVar12 = auVar9 ^ auVar2;
          iVar8 = auVar7._4_4_;
          if ((bool)(~(auVar12._4_4_ == iVar8 && auVar7._0_4_ < auVar12._0_4_ ||
                      iVar8 < auVar12._4_4_) & 1)) {
            *(undefined4 *)(&(pmVar1->_fam).field_0x0 + uVar5) = 0xc0000001;
          }
          if ((auVar12._12_4_ != auVar7._12_4_ || auVar12._8_4_ <= auVar7._8_4_) &&
              auVar12._12_4_ <= auVar7._12_4_) {
            *(undefined4 *)((long)&pmVar1[1].super_array_capacity_t<unsigned_int>._capacity + uVar5)
                 = 0xc0000001;
          }
          iVar13 = SUB164(auVar11 ^ auVar2,4);
          if (iVar13 <= iVar8 && (iVar13 != iVar8 || SUB164(auVar11 ^ auVar2,0) <= auVar7._0_4_)) {
            *(undefined4 *)(&pmVar1[1]._fam.field_0x0 + uVar5) = 0xc0000001;
            *(undefined4 *)((long)&pmVar1[2].super_array_capacity_t<unsigned_int>._capacity + uVar5)
                 = 0xc0000001;
          }
          lVar10 = auVar9._8_8_;
          auVar9._0_8_ = auVar9._0_8_ + 4;
          auVar9._8_8_ = lVar10 + 4;
          lVar10 = auVar11._8_8_;
          auVar11._0_8_ = auVar11._0_8_ + 4;
          auVar11._8_8_ = lVar10 + 4;
          uVar5 = uVar5 + 0x10;
        } while ((uVar4 * 4 + 0xc & 0xfffffffffffffff0) != uVar5);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < this->_loc_nb);
  }
  return;
}

Assistant:

void local_m_map_t::resize(tchecker::loc_id_t loc_nb, tchecker::clock_id_t clock_nb)
{
  clear();

  _loc_nb = loc_nb;
  _clock_nb = clock_nb;
  _M.resize(_loc_nb, nullptr);
  for (tchecker::loc_id_t id = 0; id < _loc_nb; ++id) {
    _M[id] = tchecker::clockbounds::allocate_map(_clock_nb);
    tchecker::clockbounds::clear(*_M[id]);
  }
}